

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O0

bool __thiscall QSqlQuery::prepare(QSqlQuery *this,QString *query)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  NumericalPrecisionPolicy NVar5;
  QSqlDriver *pQVar6;
  ulong uVar7;
  undefined8 in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool fo;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QSqlResult *in_stack_fffffffffffffed0;
  QSqlResult *in_stack_fffffffffffffed8;
  QMessageLogger *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  QString *databaseText;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QSqlError *in_stack_ffffffffffffff10;
  char local_d0 [32];
  char local_b0 [104];
  undefined1 local_48 [16];
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  databaseText = in_RDI;
  iVar4 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x139f28);
  if (iVar4 == 1) {
    plVar1 = (long *)(((in_RDI->d).d)->super_QArrayData).alloc;
    (**(code **)(*plVar1 + 0x20))(plVar1,0);
    in_stack_fffffffffffffed0 = (QSqlResult *)(((in_RDI->d).d)->super_QArrayData).alloc;
    QString::QString((QString *)0x139ffd);
    QString::QString((QString *)0x13a00a);
    QString::QString((QString *)0x13a017);
    QSqlError::QSqlError
              (in_stack_ffffffffffffff10,
               (QString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),databaseText
               ,(ErrorType)((ulong)in_RSI >> 0x20),
               (QString *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    (*in_stack_fffffffffffffed0->_vptr_QSqlResult[5])(in_stack_fffffffffffffed0,local_48);
    QSqlError::~QSqlError((QSqlError *)0x13a05e);
    QString::~QString((QString *)0x13a06b);
    QString::~QString((QString *)0x13a078);
    QString::~QString((QString *)0x13a085);
    plVar1 = (long *)(((in_RDI->d).d)->super_QArrayData).alloc;
    (**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
    in_stack_fffffffffffffed8 = (QSqlResult *)(((in_RDI->d).d)->super_QArrayData).alloc;
    NVar5 = QSqlResult::numericalPrecisionPolicy(in_stack_fffffffffffffed0);
    (*in_stack_fffffffffffffed8->_vptr_QSqlResult[0x1d])(in_stack_fffffffffffffed8,(ulong)NVar5);
  }
  else {
    isForwardOnly((QSqlQuery *)0x139f3b);
    pQVar6 = driver((QSqlQuery *)0x139f4b);
    (**(code **)(*(long *)pQVar6 + 200))();
    QSqlQuery((QSqlQuery *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    operator=((QSqlQuery *)in_stack_fffffffffffffee0,(QSqlQuery *)in_stack_fffffffffffffed8);
    ~QSqlQuery((QSqlQuery *)in_stack_fffffffffffffed0);
    setForwardOnly((QSqlQuery *)in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
    in_stack_fffffffffffffee0 = (QMessageLogger *)(((in_RDI->d).d)->super_QArrayData).alloc;
    NVar5 = QSqlResult::numericalPrecisionPolicy(in_stack_fffffffffffffed0);
    (*(code *)(*(QSqlQueryPrivate **)&in_stack_fffffffffffffee0->context)[0xe].sqlResult)
              (in_stack_fffffffffffffee0,NVar5);
  }
  pQVar6 = driver((QSqlQuery *)0x13a0d3);
  if (pQVar6 == (QSqlDriver *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcSqlQuery();
    anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffed0,
               (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x13a130);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (char *)0x13a149);
      QMessageLogger::warning(local_b0,"QSqlQuery::prepare: no driver");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    bVar2 = false;
  }
  else {
    pQVar6 = driver((QSqlQuery *)0x13a17d);
    uVar7 = (**(code **)(*(long *)pQVar6 + 0x60))();
    if ((uVar7 & 1) != 0) {
      driver((QSqlQuery *)0x13a196);
      bVar2 = QSqlDriver::isOpenError((QSqlDriver *)in_stack_fffffffffffffed0);
      if (!bVar2) {
        bVar2 = QString::isEmpty((QString *)0x13a241);
        if (bVar2) {
          local_38 = 0xaaaaaaaaaaaaaaaa;
          local_30 = 0xaaaaaaaaaaaaaaaa;
          lcSqlQuery();
          anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffed0,
                     (QLoggingCategory *)
                     CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x13a29d);
            QMessageLogger::QMessageLogger
                      (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                       (char *)0x13a2b3);
            QMessageLogger::warning(&stack0xffffffffffffff10,"QSqlQuery::prepare: empty query");
            local_30 = local_30 & 0xffffffffffffff00;
          }
          bVar2 = false;
        }
        else {
          plVar1 = (long *)(((in_RDI->d).d)->super_QArrayData).alloc;
          bVar3 = (**(code **)(*plVar1 + 0x58))(plVar1,in_RSI);
          bVar2 = (bool)(bVar3 & 1);
        }
        goto LAB_0013a2f4;
      }
    }
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    lcSqlQuery();
    anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffed0,
               (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x13a1fa);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (char *)0x13a210);
      QMessageLogger::warning(local_d0,"QSqlQuery::prepare: database not open");
      local_20 = local_20 & 0xffffffffffffff00;
    }
    bVar2 = false;
  }
LAB_0013a2f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QSqlQuery::prepare(const QString& query)
{
    if (d->ref.loadRelaxed() != 1) {
        bool fo = isForwardOnly();
        *this = QSqlQuery(driver()->createResult());
        setForwardOnly(fo);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    } else {
        d->sqlResult->setActive(false);
        d->sqlResult->setLastError(QSqlError());
        d->sqlResult->setAt(QSql::BeforeFirstRow);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    }
    if (!driver()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: no driver");
        return false;
    }
    if (!driver()->isOpen() || driver()->isOpenError()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: database not open");
        return false;
    }
    if (query.isEmpty()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: empty query");
        return false;
    }
#ifdef QT_DEBUG_SQL
    qCDebug(lcSqlQuery, "\n QSqlQuery::prepare: %ls", qUtf16Printable(query));
#endif
    return d->sqlResult->savePrepare(query);
}